

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  Descriptor *message;
  EnumDescriptor *en;
  undefined4 local_28;
  undefined4 local_24;
  int i_1;
  int i;
  GeneratorContext *generator_context_local;
  bool is_descriptor_local;
  FileDescriptor *file_local;
  
  GenerateMetadataFile(file,is_descriptor,generator_context);
  local_24 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(file);
    if (iVar1 <= local_24) break;
    message = FileDescriptor::message_type(file,local_24);
    GenerateMessageFile(file,message,is_descriptor,generator_context);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar1 = FileDescriptor::enum_type_count(file);
    if (iVar1 <= local_28) break;
    en = FileDescriptor::enum_type(file,local_28);
    GenerateEnumFile(file,en,is_descriptor,generator_context);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void GenerateFile(const FileDescriptor* file, bool is_descriptor,
                  GeneratorContext* generator_context) {
  GenerateMetadataFile(file, is_descriptor, generator_context);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageFile(file, file->message_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumFile(file, file->enum_type(i), is_descriptor,
                     generator_context);
  }
}